

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1a670e0::Scenario::ReceivedResponse(Scenario *this,NodeId peer,uint256 *txhash)

{
  pointer *pppVar1;
  undefined8 *puVar2;
  _Manager_type *pp_Var3;
  long lVar4;
  Runner *pRVar5;
  pointer ppVar6;
  pointer ppVar7;
  _Manager_type p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  size_type __n;
  long lVar14;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar15;
  pointer ppVar16;
  pointer ppVar17;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__cur;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar18;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar5 = this->m_runner;
  uVar9 = *(undefined8 *)(txhash->super_base_blob<256U>).m_data._M_elems;
  uVar10 = *(undefined8 *)((txhash->super_base_blob<256U>).m_data._M_elems + 8);
  lVar11 = *(long *)((txhash->super_base_blob<256U>).m_data._M_elems + 0x10);
  lVar12 = *(long *)((txhash->super_base_blob<256U>).m_data._M_elems + 0x18);
  ppVar17 = (pRVar5->actions).
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (undefined4)uVar9;
  uStack_54 = (undefined4)((ulong)uVar9 >> 0x20);
  uStack_50 = (undefined4)uVar10;
  uStack_4c = (undefined4)((ulong)uVar10 >> 0x20);
  if (ppVar17 ==
      (pRVar5->actions).
      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(&pRVar5->actions,1,"vector::_M_realloc_insert");
    ppVar6 = (pRVar5->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar7 = (pRVar5->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar14 = (long)ppVar17 - (long)ppVar6 >> 3;
    if (__n == 0) {
      ppVar15 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                 *)0x0;
    }
    else {
      ppVar15 = __gnu_cxx::
                new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                            *)&pRVar5->actions,__n,(void *)0x0);
    }
    (&ppVar15->first)[lVar14].__r = (this->m_now).__r;
    puVar2 = (undefined8 *)((long)&(ppVar15->second).super__Function_base._M_functor + lVar14 * 8);
    *puVar2 = 0;
    puVar2[1] = 0;
    pp_Var3 = &(ppVar15->second).super__Function_base._M_manager + lVar14;
    *pp_Var3 = (_Manager_type)0x0;
    pp_Var3[1] = (_Manager_type)0x0;
    plVar13 = (long *)operator_new(0x30);
    *plVar13 = (long)pRVar5;
    plVar13[1] = peer;
    *(undefined4 *)(plVar13 + 2) = local_58;
    *(undefined4 *)((long)plVar13 + 0x14) = uStack_54;
    *(undefined4 *)(plVar13 + 3) = uStack_50;
    *(undefined4 *)((long)plVar13 + 0x1c) = uStack_4c;
    plVar13[4] = lVar11;
    plVar13[5] = lVar12;
    *(long **)((long)&(ppVar15->second).super__Function_base._M_functor + lVar14 * 8) = plVar13;
    (&(ppVar15->second)._M_invoker)[lVar14] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
         ::_M_invoke;
    (&(ppVar15->second).super__Function_base._M_manager)[lVar14] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
         ::_M_manager;
    ppVar18 = ppVar15;
    for (ppVar16 = ppVar6; ppVar16 != ppVar17; ppVar16 = ppVar16 + 1) {
      (ppVar18->first).__r = (ppVar16->first).__r;
      *(undefined8 *)&(ppVar18->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar18->second).super__Function_base._M_functor + 8) = 0;
      (ppVar18->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar18->second)._M_invoker = (ppVar16->second)._M_invoker;
      p_Var8 = (ppVar16->second).super__Function_base._M_manager;
      if (p_Var8 != (_Manager_type)0x0) {
        uVar9 = *(undefined8 *)((long)&(ppVar16->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar18->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar16->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar18->second).super__Function_base._M_functor + 8) = uVar9;
        (ppVar18->second).super__Function_base._M_manager = p_Var8;
        (ppVar16->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar16->second)._M_invoker = (_Invoker_type)0x0;
      }
      ppVar18 = ppVar18 + 1;
    }
    for (; ppVar18 = ppVar18 + 1, ppVar7 != ppVar17; ppVar17 = ppVar17 + 1) {
      (ppVar18->first).__r = (ppVar17->first).__r;
      *(undefined8 *)&(ppVar18->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar18->second).super__Function_base._M_functor + 8) = 0;
      (ppVar18->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar18->second)._M_invoker = (ppVar17->second)._M_invoker;
      p_Var8 = (ppVar17->second).super__Function_base._M_manager;
      if (p_Var8 != (_Manager_type)0x0) {
        uVar9 = *(undefined8 *)((long)&(ppVar17->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar18->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar17->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar18->second).super__Function_base._M_functor + 8) = uVar9;
        (ppVar18->second).super__Function_base._M_manager = p_Var8;
        (ppVar17->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar17->second)._M_invoker = (_Invoker_type)0x0;
      }
    }
    if (ppVar6 != (pointer)0x0) {
      operator_delete(ppVar6,(long)(pRVar5->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar6
                     );
    }
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar15;
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar18;
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar15 + __n;
  }
  else {
    (ppVar17->first).__r = (this->m_now).__r;
    *(undefined8 *)&(ppVar17->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar17->second).super__Function_base._M_functor + 8) = 0;
    (ppVar17->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar17->second)._M_invoker = (_Invoker_type)0x0;
    plVar13 = (long *)operator_new(0x30);
    *plVar13 = (long)pRVar5;
    plVar13[1] = peer;
    *(undefined4 *)(plVar13 + 2) = local_58;
    *(undefined4 *)((long)plVar13 + 0x14) = uStack_54;
    *(undefined4 *)(plVar13 + 3) = uStack_50;
    *(undefined4 *)((long)plVar13 + 0x1c) = uStack_4c;
    plVar13[4] = lVar11;
    plVar13[5] = lVar12;
    *(long **)&(ppVar17->second).super__Function_base._M_functor = plVar13;
    (ppVar17->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
         ::_M_invoke;
    (ppVar17->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
         ::_M_manager;
    pppVar1 = &(pRVar5->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ReceivedResponse(NodeId peer, const uint256& txhash)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedResponse(peer, txhash);
            runner.txrequest.SanityCheck();
        });
    }